

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<Fad<Fad<double>_>,_3>::Resize(TPZManVector<Fad<Fad<double>_>,_3> *this,int64_t newsize)

{
  Vector<double> *this_00;
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  Fad<Fad<double>_> *pFVar3;
  Fad<Fad<double>_> *pFVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  long lVar8;
  Fad<double> *pFVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  
  if (-1 < newsize) {
    lVar8 = (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements;
    if (lVar8 != newsize) {
      lVar10 = (this->super_TPZVec<Fad<Fad<double>_>_>).fNAlloc;
      if (lVar10 < newsize) {
        if ((ulong)newsize < 4) {
          pFVar4 = (this->super_TPZVec<Fad<Fad<double>_>_>).fStore;
          if (pFVar4 != this->fExtAlloc) {
            if (0 < lVar8) {
              lVar8 = 0;
              lVar10 = 0;
              do {
                pFVar4 = (this->super_TPZVec<Fad<Fad<double>_>_>).fStore;
                this_00 = (Vector<double> *)((long)&this->fExtAlloc[0].val_.dx_.num_elts + lVar8);
                this_00[-1].ptr_to_data = *(double **)((long)&(pFVar4->val_).val_ + lVar8);
                Vector<double>::operator=
                          (this_00,(Vector<double> *)((long)&(pFVar4->val_).dx_.num_elts + lVar8));
                *(undefined8 *)(this_00 + 1) =
                     *(undefined8 *)((long)&(pFVar4->val_).defaultVal + lVar8);
                Vector<Fad<double>_>::operator=
                          ((Vector<Fad<double>_> *)((long)&this->fExtAlloc[0].dx_.num_elts + lVar8),
                           (Vector<Fad<double>_> *)((long)&(pFVar4->dx_).num_elts + lVar8));
                *(undefined8 *)((long)&this->fExtAlloc[0].defaultVal.val_ + lVar8) =
                     *(undefined8 *)((long)&(pFVar4->defaultVal).val_ + lVar8);
                Vector<double>::operator=
                          ((Vector<double> *)
                           ((long)&this->fExtAlloc[0].defaultVal.dx_.num_elts + lVar8),
                           (Vector<double> *)((long)&(pFVar4->defaultVal).dx_.num_elts + lVar8));
                *(undefined8 *)((long)&this->fExtAlloc[0].defaultVal.defaultVal + lVar8) =
                     *(undefined8 *)((long)&(pFVar4->defaultVal).defaultVal + lVar8);
                lVar10 = lVar10 + 1;
                lVar8 = lVar8 + 0x58;
              } while (lVar10 < (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements);
              pFVar4 = (this->super_TPZVec<Fad<Fad<double>_>_>).fStore;
            }
            if (pFVar4 != (Fad<Fad<double>_> *)0x0) {
              dVar12 = pFVar4[-1].defaultVal.defaultVal;
              if (dVar12 != 0.0) {
                pFVar3 = pFVar4 + (long)dVar12 + -1;
                lVar8 = (long)dVar12 * -0x58;
                do {
                  pFVar9 = &pFVar3->val_;
                  Fad<double>::~Fad((Fad<double> *)((Vector<Fad<double>_> *)(pFVar9 + 1) + 1));
                  Vector<Fad<double>_>::~Vector((Vector<Fad<double>_> *)(pFVar9 + 1));
                  Fad<double>::~Fad(pFVar9);
                  pFVar3 = (Fad<Fad<double>_> *)(pFVar9 + -3);
                  lVar8 = lVar8 + 0x58;
                } while (lVar8 != 0);
              }
              operator_delete__(&pFVar4[-1].defaultVal.defaultVal,(long)dVar12 * 0x58 + 8);
            }
            (this->super_TPZVec<Fad<Fad<double>_>_>).fStore = this->fExtAlloc;
          }
          (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements = newsize;
          (this->super_TPZVec<Fad<Fad<double>_>_>).fNAlloc = 0;
        }
        else {
          dVar12 = (double)lVar10 * 1.2;
          uVar11 = (long)dVar12;
          if (dVar12 < (double)newsize) {
            uVar11 = newsize;
          }
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar11;
          uVar5 = SUB168(auVar2 * ZEXT816(0x58),0);
          uVar6 = uVar5 + 8;
          if (0xfffffffffffffff7 < uVar5) {
            uVar6 = 0xffffffffffffffff;
          }
          uVar5 = 0xffffffffffffffff;
          if (SUB168(auVar2 * ZEXT816(0x58),8) == 0) {
            uVar5 = uVar6;
          }
          puVar7 = (ulong *)operator_new__(uVar5);
          *puVar7 = uVar11;
          if (uVar11 != 0) {
            lVar10 = 0;
            do {
              *(undefined8 *)((long)puVar7 + lVar10 + 0x10) = 0;
              *(undefined4 *)((long)puVar7 + lVar10 + 0x18) = 0;
              puVar1 = (undefined8 *)((long)puVar7 + lVar10 + 0x50);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)((long)puVar7 + lVar10 + 0x20);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined4 *)((long)puVar7 + lVar10 + 0x30) = 0;
              puVar1 = (undefined8 *)((long)puVar7 + lVar10 + 0x38);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined4 *)((long)puVar7 + lVar10 + 0x48) = 0;
              lVar10 = lVar10 + 0x58;
            } while (uVar11 * 0x58 - lVar10 != 0);
          }
          if (0 < lVar8) {
            lVar8 = 0;
            lVar10 = 0;
            do {
              pFVar4 = (this->super_TPZVec<Fad<Fad<double>_>_>).fStore;
              *(undefined8 *)((long)puVar7 + lVar8 + 0x10) =
                   *(undefined8 *)((long)&(pFVar4->val_).val_ + lVar8);
              Vector<double>::operator=
                        ((Vector<double> *)((long)puVar7 + lVar8 + 0x18),
                         (Vector<double> *)((long)&(pFVar4->val_).dx_.num_elts + lVar8));
              *(undefined8 *)((long)puVar7 + lVar8 + 0x28) =
                   *(undefined8 *)((long)&(pFVar4->val_).defaultVal + lVar8);
              Vector<Fad<double>_>::operator=
                        ((Vector<Fad<double>_> *)((long)puVar7 + lVar8 + 0x30),
                         (Vector<Fad<double>_> *)((long)&(pFVar4->dx_).num_elts + lVar8));
              *(undefined8 *)((long)puVar7 + lVar8 + 0x40) =
                   *(undefined8 *)((long)&(pFVar4->defaultVal).val_ + lVar8);
              Vector<double>::operator=
                        ((Vector<double> *)((long)puVar7 + lVar8 + 0x48),
                         (Vector<double> *)((long)&(pFVar4->defaultVal).dx_.num_elts + lVar8));
              *(undefined8 *)((long)puVar7 + lVar8 + 0x58) =
                   *(undefined8 *)((long)&(pFVar4->defaultVal).defaultVal + lVar8);
              lVar10 = lVar10 + 1;
              lVar8 = lVar8 + 0x58;
            } while (lVar10 < (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements);
          }
          pFVar4 = (this->super_TPZVec<Fad<Fad<double>_>_>).fStore;
          if (pFVar4 != (Fad<Fad<double>_> *)0x0 && pFVar4 != this->fExtAlloc) {
            dVar12 = pFVar4[-1].defaultVal.defaultVal;
            if (dVar12 != 0.0) {
              pFVar3 = pFVar4 + (long)dVar12 + -1;
              lVar8 = (long)dVar12 * -0x58;
              do {
                pFVar9 = &pFVar3->val_;
                Fad<double>::~Fad((Fad<double> *)((Vector<Fad<double>_> *)(pFVar9 + 1) + 1));
                Vector<Fad<double>_>::~Vector((Vector<Fad<double>_> *)(pFVar9 + 1));
                Fad<double>::~Fad(pFVar9);
                pFVar3 = (Fad<Fad<double>_> *)(pFVar9 + -3);
                lVar8 = lVar8 + 0x58;
              } while (lVar8 != 0);
            }
            operator_delete__(&pFVar4[-1].defaultVal.defaultVal,(long)dVar12 * 0x58 + 8);
          }
          (this->super_TPZVec<Fad<Fad<double>_>_>).fStore = (Fad<Fad<double>_> *)(puVar7 + 1);
          (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements = newsize;
          (this->super_TPZVec<Fad<Fad<double>_>_>).fNAlloc = uVar11;
        }
      }
      else {
        (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements = newsize;
      }
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}